

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relations.cpp
# Opt level: O1

bool dg::vr::Relations::isSigned(Type type)

{
  if (type - SLE < 8) {
    return (0x33U >> (type - SLE & 0x1f) & 1) != 0;
  }
  abort();
}

Assistant:

bool Relations::isSigned(Type type) {
    switch (type) {
    case SLT:
    case SLE:
    case SGT:
    case SGE:
        return true;
    case ULT:
    case ULE:
    case UGT:
    case UGE:
        return false;
    default:
        assert(0 && "unreachable");
        abort();
    }
}